

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

void deqp::gles31::Functional::(anonymous_namespace)::ImageLoadAndStoreCase::
     replaceBadFloatReinterpretValues<(tcu::TextureFormat::ChannelType)35,tcu::Float<unsigned_int,8,23,127,3u>,unsigned_int>
               (LayeredImage *image,TextureFormat *imageFormat)

{
  bool bVar1;
  TextureType TVar2;
  int iVar3;
  int iVar4;
  StorageType SVar5;
  IVec3 *v;
  void *pvVar6;
  int local_a0;
  int local_9c;
  Float<unsigned_int,_8,_23,_127,_3U> local_98;
  Float<unsigned_int,_8,_23,_127,_3U> local_94;
  StorageType *pSStack_90;
  Float<unsigned_int,_8,_23,_127,_3U> f;
  void *channelData;
  int c;
  void *pixelData;
  int x;
  int y;
  void *data;
  undefined1 local_60 [4];
  int rowPitch;
  PixelBufferAccess sliceAccess;
  int z;
  int numSlicesOrFaces;
  IVec3 imageSize;
  int imageNumChannels;
  int pixelSize;
  TextureFormat *imageFormat_local;
  LayeredImage *image_local;
  
  imageSize.m_data[2] = tcu::TextureFormat::getPixelSize(imageFormat);
  if (imageFormat->order == R) {
    local_9c = 1;
  }
  else {
    local_9c = 0;
    if (imageFormat->order == RGBA) {
      local_9c = 4;
    }
  }
  imageSize.m_data[1] = local_9c;
  v = anon_unknown_1::LayeredImage::getSize(image);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&z,v);
  TVar2 = anon_unknown_1::LayeredImage::getImageType(image);
  if (TVar2 == TEXTURETYPE_CUBE) {
    local_a0 = 6;
  }
  else {
    local_a0 = tcu::Vector<int,_3>::z((Vector<int,_3> *)&z);
  }
  for (sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_ = CUBEFACE_NEGATIVE_X;
      (int)sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_ < local_a0;
      sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_ =
           sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_ + CUBEFACE_POSITIVE_X) {
    TVar2 = anon_unknown_1::LayeredImage::getImageType(image);
    if (TVar2 == TEXTURETYPE_CUBE) {
      anon_unknown_1::LayeredImage::getCubeFaceAccess
                ((PixelBufferAccess *)local_60,image,
                 sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_);
    }
    else {
      anon_unknown_1::LayeredImage::getSliceAccess
                ((PixelBufferAccess *)local_60,image,
                 sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_);
    }
    iVar3 = tcu::ConstPixelBufferAccess::getRowPitch((ConstPixelBufferAccess *)local_60);
    pvVar6 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)local_60);
    for (pixelData._4_4_ = 0; iVar4 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&z),
        pixelData._4_4_ < iVar4; pixelData._4_4_ = pixelData._4_4_ + 1) {
      for (pixelData._0_4_ = 0; iVar4 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&z),
          (int)pixelData < iVar4; pixelData._0_4_ = (int)pixelData + 1) {
        iVar4 = (int)pixelData * imageSize.m_data[2];
        for (channelData._4_4_ = 0; channelData._4_4_ < imageSize.m_data[1];
            channelData._4_4_ = channelData._4_4_ + 1) {
          pSStack_90 = (StorageType *)
                       ((long)pvVar6 +
                       (long)((channelData._4_4_ * imageSize.m_data[2]) / imageSize.m_data[1]) +
                       (long)iVar4 + (long)(pixelData._4_4_ * iVar3));
          tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_94,*pSStack_90);
          bVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::isDenorm(&local_94);
          if (((bVar1) ||
              (bVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::isInf(&local_94), bVar1)) ||
             (bVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::isNaN(&local_94), bVar1)) {
            tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_98,0.0);
            SVar5 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_98);
            *pSStack_90 = SVar5;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ImageLoadAndStoreCase::replaceBadFloatReinterpretValues (LayeredImage& image, const TextureFormat& imageFormat)
{
	// Find potential bad values, such as nan or inf, and replace with something else.
	const int		pixelSize			= imageFormat.getPixelSize();
	const int		imageNumChannels	= imageFormat.order == tcu::TextureFormat::R	? 1
										: imageFormat.order == tcu::TextureFormat::RGBA	? 4
										: 0;
	const IVec3		imageSize			= image.getSize();
	const int		numSlicesOrFaces	= image.getImageType() == TEXTURETYPE_CUBE ? 6 : imageSize.z();

	DE_ASSERT(pixelSize % imageNumChannels == 0);

	for (int z = 0; z < numSlicesOrFaces; z++)
	{
		const PixelBufferAccess		sliceAccess		= image.getImageType() == TEXTURETYPE_CUBE ? image.getCubeFaceAccess((tcu::CubeFace)z) : image.getSliceAccess(z);
		const int					rowPitch		= sliceAccess.getRowPitch();
		void *const					data			= sliceAccess.getDataPtr();

		for (int y = 0; y < imageSize.y(); y++)
		for (int x = 0; x < imageSize.x(); x++)
		{
			void *const pixelData = (deUint8*)data + y*rowPitch + x*pixelSize;

			for (int c = 0; c < imageNumChannels; c++)
			{
				void *const			channelData		= (deUint8*)pixelData + c*pixelSize/imageNumChannels;
				const TcuFloatType	f				(*(TcuFloatTypeStorageType*)channelData);

				if (f.isDenorm() || f.isInf() || f.isNaN())
					*(TcuFloatTypeStorageType*)channelData = TcuFloatType(0.0f).bits();
			}
		}
	}
}